

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_DeletedKey_Test
          (HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  pointer __ptr;
  
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c172b8;
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c17378;
  __ptr = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.table;
  if (__ptr != (pointer)0x0) {
    free(__ptr);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, DeletedKey) {
  if (!this->ht_.supports_deleted_key()) return;
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(1));
  EXPECT_EQ(2u, this->ht_.size());
  this->ht_.erase(this->UniqueKey(20));
  EXPECT_EQ(1u, this->ht_.size());

  // Changing the deleted key is fine.
  this->ht_.set_deleted_key(this->UniqueKey(2));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(2));
  EXPECT_EQ(1u, this->ht_.size());
}